

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_vb.c
# Opt level: O2

void saa1099v_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  SAA_ENV_GEN *pSVar1;
  size_t __n;
  byte bVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  UINT16 inc;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  SAA_ENV_GEN *saaEGen;
  ulong uVar15;
  bool bVar16;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (*(char *)((long)param + 0x90) != '\0') {
    pSVar1 = (SAA_ENV_GEN *)((long)param + 0x7c);
    for (uVar15 = 0; uVar15 != samples; uVar15 = uVar15 + 1) {
      pbVar6 = (byte *)((long)param + 8);
      for (uVar7 = 0; uVar7 != 6; uVar7 = uVar7 + 1) {
        if (pbVar6[0xd] == 0) {
          bVar2 = pbVar6[4];
          if (bVar2 == 0) {
            if (pbVar6[5] == 0) {
              bVar5 = false;
              uVar8 = 1;
              uVar11 = uVar8;
            }
            else {
              bVar5 = true;
              uVar8 = 1;
              uVar11 = *(uint *)((long)param + (ulong)(2 < uVar7) * 0x10 + 0x60) & 1;
            }
LAB_00161afa:
            iVar9 = (uVar8 & uVar11) * 2;
          }
          else {
            uVar8 = (uint)pbVar6[0xc];
            if (pbVar6[5] == 0) {
              bVar5 = false;
              uVar11 = 1;
              goto LAB_00161afa;
            }
            bVar5 = true;
            if (pbVar6[0xc] == 0) {
              iVar9 = 0;
            }
            else {
              iVar9 = uVar8 + (*(uint *)((long)param + (ulong)(2 < uVar7) * 0x10 + 0x60) & 1);
            }
          }
          if ((((char)uVar7 == '\x05') || (((uint)uVar7 & 0xff) == 2)) &&
             (bVar16 = 2 < uVar7, pSVar1[bVar16].enable != '\0')) {
            iVar4 = *(int *)((long)param + (ulong)(*pbVar6 & 0xfffffffe) * 4 + 0xb4);
            iVar10 = (int)((uint)pSVar1[bVar16].volL * iVar4) >> 4;
            bVar3 = pbVar6[1];
            iVar12 = (int)((uint)pSVar1[bVar16].volR *
                          *(int *)((long)param + (ulong)(bVar3 & 0xfffffffe) * 4 + 0xb4)) >> 4;
            if (bVar2 != 0 || bVar5) {
LAB_00161bba:
              (*outputs)[uVar15] = (*outputs)[uVar15] + iVar10 * (iVar9 + -1);
              outputs[1][uVar15] = outputs[1][uVar15] + (iVar9 + -1) * iVar12;
              goto LAB_00161bec;
            }
            (*outputs)[uVar15] = (*outputs)[uVar15] + (iVar10 * iVar9 - iVar4);
            iVar12 = iVar12 * iVar9 - *(int *)((long)param + (ulong)(bVar3 & 0xfffffffe) * 4 + 0xb4)
            ;
          }
          else {
            iVar10 = *(int *)((long)param + (ulong)*pbVar6 * 4 + 0xb4);
            iVar12 = *(int *)((long)param + (ulong)pbVar6[1] * 4 + 0xb4);
            if (!(bool)(bVar2 == 0 & (bVar5 ^ 1U))) goto LAB_00161bba;
            (*outputs)[uVar15] = (*outputs)[uVar15] + iVar10 * iVar9;
            iVar12 = iVar12 * iVar9;
          }
          outputs[1][uVar15] = outputs[1][uVar15] + iVar12;
        }
LAB_00161bec:
        pbVar6 = pbVar6 + 0xe;
      }
      uVar7 = *(long *)((long)param + 0x100) + *(long *)((long)param + 0xf8);
      *(ulong *)((long)param + 0x100) = uVar7;
      uVar7 = uVar7 >> 0x20;
      while( true ) {
        iVar9 = (int)uVar7;
        uVar7 = (ulong)(iVar9 - 1);
        if (iVar9 == 0) break;
        if (*(char *)((long)param + 0x91) == '\0') {
          for (lVar13 = 0; lVar13 != 0x54; lVar13 = lVar13 + 0xe) {
            saa_freq_gen_step((SAA_FREQ_GEN *)((long)param + lVar13 + 0xe),
                              (UINT16)(1 << (*(byte *)((long)param + lVar13 + 0xb) & 0x1f)));
            if ((*(char *)((long)param + lVar13 + 0x13) != '\0') &&
               (*(char *)((long)param + lVar13 + 0x12) == '\0')) {
              pbVar6 = (byte *)((long)param + lVar13 + 0x14);
              *pbVar6 = *pbVar6 ^ 1;
            }
          }
        }
        pcVar14 = (char *)((long)param + 0x5c);
        for (lVar13 = 0; lVar13 != 0x54; lVar13 = lVar13 + 0x2a) {
          inc = 1;
          if (*pcVar14 == '\x03') {
            if (*(char *)((long)param + lVar13 + 0x13) == '\0') {
              inc = 0;
            }
            else {
              inc = (UINT16)(*(char *)((long)param + lVar13 + 0x12) == '\0');
            }
          }
          saa_freq_gen_step((SAA_FREQ_GEN *)(pcVar14 + 8),inc);
          if (pcVar14[0xd] != '\0') {
            uVar11 = *(uint *)(pcVar14 + 4);
            *(uint *)(pcVar14 + 4) = ((uVar11 >> 10 ^ uVar11 >> 0x11) & 1) + uVar11 * 2;
          }
          pcVar14 = pcVar14 + 0x10;
        }
        pcVar14 = (char *)((long)param + 0x21);
        saaEGen = pSVar1;
        for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
          if (((saaEGen->extClock == '\0') && (*pcVar14 != '\0')) && (pcVar14[-1] == '\0')) {
            if (((char)saaEGen->flags < '\0') && (saaEGen->reload != '\0')) {
              saa_envgen_load((SAA_CHIP *)param,(UINT8)lVar13);
            }
            saa_envgen_step(saaEGen);
          }
          pcVar14 = pcVar14 + 0x2a;
          saaEGen = saaEGen + 1;
        }
      }
      *(undefined4 *)((long)param + 0x104) = 0;
    }
  }
  return;
}

Assistant:

static void saa1099v_update(void* param, UINT32 samples, DEV_SMPL** outputs)
{
	SAA_CHIP* saa = (SAA_CHIP*)param;
	SAA_CHN* saaCh;
	UINT32 curSmpl;
	UINT8 curChn;
	UINT8 neChn;	// noise/envelope channel
	UINT8 noDCremove;
	DEV_SMPL outState;
	DEV_SMPL outVolL;
	DEV_SMPL outVolR;
	
	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	if (! saa->allOn)
		return;
	
	for (curSmpl = 0; curSmpl < samples; curSmpl ++)
	{
		for (curChn = 0; curChn < 6; curChn ++)
		{
			saaCh = &saa->channels[curChn];
			if (saaCh->muted)
				continue;
			neChn = curChn / 3;
			noDCremove = 0;
			
			if (saaCh->toneOn && saaCh->noiseOn)
			{
				// mixing tone+noise works like this
				outState = saaCh->state;
				if (saaCh->state)
					outState += (saa->noise[neChn].state & 0x01);
			}
			else
			{
				outState  = (saaCh->toneOn) ? saaCh->state : 1;
				outState &= (saaCh->noiseOn) ? (saa->noise[neChn].state & 0x01) : 1;
				outState *= 2;	// make the same amplitude as when mixing tone+noise
			}
			
			if ((curChn == 2 || curChn == 5) && saa->env[neChn].enable)
			{
				// enabling the envelope generator disables amplitude bit 0
				outVolL = (saa->volTbl[saaCh->volL & ~0x01] * saa->env[neChn].volL) >> 4;
				outVolR = (saa->volTbl[saaCh->volR & ~0x01] * saa->env[neChn].volR) >> 4;
				if (! saaCh->toneOn && ! saaCh->noiseOn)
					noDCremove = 2;
			}
			else
			{
				outVolL = saa->volTbl[saaCh->volL];
				outVolR = saa->volTbl[saaCh->volR];
				if (! saaCh->toneOn && ! saaCh->noiseOn)
					noDCremove = 1;
			}
			
			// tone XOR noise enabled: outState can be: 0 [off], 2 [on]
			// tone + noise enabled: outState can be: 0 [both off], 1 [only tone on], 2 [both on]
			if (! noDCremove)
			{
				outState = outState - 1;	// DC offset removal and make bipolar
				outputs[0][curSmpl] += outState * outVolL;
				outputs[1][curSmpl] += outState * outVolR;
			}
			else if (noDCremove == 1)
			{
				// just ignore offset removal (makes software-PCM work)
				outputs[0][curSmpl] += outState * outVolL;
				outputs[1][curSmpl] += outState * outVolR;
			}
			else //if (noDCremove == 2)
			{
				// set "center" based on current volume level (for EnvGen-based sounds)
				outputs[0][curSmpl] += outState * outVolL - saa->volTbl[saaCh->volL & ~0x01];
				outputs[1][curSmpl] += outState * outVolR - saa->volTbl[saaCh->volR & ~0x01];
			}
		}
		
		// Updating after calculating the sample output improves emulation of a few artifacts.
		// (like the peak down after the frequency generator reset)
		RC_STEP(&saa->stepCntr);
		saa_advance(saa, RC_GET_VAL(&saa->stepCntr));
		RC_MASK(&saa->stepCntr);
	}
	
	return;
}